

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

Header * __thiscall
kj::Vector<kj::HttpHeaders::Header>::add<kj::HttpHeaders::Header>
          (Vector<kj::HttpHeaders::Header> *this,Header *params)

{
  bool bVar1;
  Header *pHVar2;
  Header *params_local;
  Vector<kj::HttpHeaders::Header> *this_local;
  
  bVar1 = ArrayBuilder<kj::HttpHeaders::Header>::isFull(&this->builder);
  if (bVar1) {
    grow(this,0);
  }
  pHVar2 = fwd<kj::HttpHeaders::Header>(params);
  pHVar2 = ArrayBuilder<kj::HttpHeaders::Header>::add<kj::HttpHeaders::Header>
                     (&this->builder,pHVar2);
  return pHVar2;
}

Assistant:

inline T& add(Params&&... params) {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }